

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

SynchEvent * absl::EnsureSynchEvent(atomic<long> *addr,char *name,intptr_t bits,intptr_t lockbit)

{
  SynchEvent **ppSVar1;
  ulong uVar2;
  size_t sVar3;
  SynchEvent *pSVar4;
  char *__s;
  SynchEvent **ppSVar5;
  bool bVar6;
  
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  ppSVar1 = (SynchEvent **)(synch_event + ((long)addr % 0x407 & 0xffffffffU) * 8);
  ppSVar5 = ppSVar1;
  while (pSVar4 = *ppSVar5, pSVar4 != (SynchEvent *)0x0) {
    if ((pSVar4->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      pSVar4->refcount = pSVar4->refcount + 1;
      goto LAB_0013e71d;
    }
    ppSVar5 = &pSVar4->next;
  }
  __s = "";
  if (name != (char *)0x0) {
    __s = name;
  }
  sVar3 = strlen(__s);
  pSVar4 = (SynchEvent *)base_internal::LowLevelAlloc::Alloc(sVar3 + 0x30);
  pSVar4->refcount = 2;
  pSVar4->masked_addr = (ulong)addr ^ 0xf03a5f7bf03a5f7b;
  pSVar4->invariant = (_func_void_void_ptr *)0x0;
  pSVar4->arg = (void *)0x0;
  pSVar4->log = false;
  strcpy(pSVar4->name,__s);
  pSVar4->next = *ppSVar1;
  do {
    do {
      uVar2 = (addr->super___atomic_base<long>)._M_i;
      if ((bits & ~uVar2) == 0) goto LAB_0013e714;
    } while ((uVar2 & lockbit) != 0);
    LOCK();
    bVar6 = uVar2 == (addr->super___atomic_base<long>)._M_i;
    if (bVar6) {
      (addr->super___atomic_base<long>)._M_i = uVar2 | bits;
    }
    UNLOCK();
  } while (!bVar6);
LAB_0013e714:
  *ppSVar1 = pSVar4;
LAB_0013e71d:
  base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
  return pSVar4;
}

Assistant:

static SynchEvent *EnsureSynchEvent(std::atomic<intptr_t> *addr,
                                    const char *name, intptr_t bits,
                                    intptr_t lockbit) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  // first look for existing SynchEvent struct..
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e == nullptr) {  // no SynchEvent struct found; make one.
    if (name == nullptr) {
      name = "";
    }
    size_t l = strlen(name);
    e = reinterpret_cast<SynchEvent *>(
        base_internal::LowLevelAlloc::Alloc(sizeof(*e) + l));
    e->refcount = 2;    // one for return value, one for linked list
    e->masked_addr = base_internal::HidePtr(addr);
    e->invariant = nullptr;
    e->arg = nullptr;
    e->log = false;
    strcpy(e->name, name);  // NOLINT(runtime/printf)
    e->next = synch_event[h];
    AtomicSetBits(addr, bits, lockbit);
    synch_event[h] = e;
  } else {
    e->refcount++;      // for return value
  }
  synch_event_mu.Unlock();
  return e;
}